

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

_Bool sysbvm_scanner_isOperatorCharacter(int c)

{
  _Bool local_9;
  int c_local;
  
  switch(c) {
  case 0x21:
  case 0x25:
  case 0x26:
  case 0x2a:
  case 0x2b:
  case 0x2d:
  case 0x2f:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x5c:
  case 0x5e:
  case 0x7c:
  case 0x7e:
    local_9 = true;
    break;
  default:
    local_9 = false;
  }
  return local_9;
}

Assistant:

static inline bool sysbvm_scanner_isOperatorCharacter(int c)
{
    switch(c)
    {
    case '+':
    case '-':
    case '/':
    case '\\':
    case '*':
    case '~':
    case '<':
    case '>':
    case '=':
    case '@':
    case '%':
    case '|':
    case '&':
    case '?':
    case '!':
    case '^':
        return true;
    default:
        return false;
    }
}